

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

void capnp::_::WireHelpers::zeroObject
               (SegmentBuilder *segment,CapTableBuilder *capTable,WirePointer *ref)

{
  bool bVar1;
  Kind KVar2;
  Id<unsigned_int,_capnp::_::Segment> id;
  uint uVar3;
  BuilderArena *pBVar4;
  SegmentBuilder *pSVar5;
  WirePointer *this;
  word *pwVar6;
  Fault local_40;
  Fault f;
  WirePointer *pad;
  WirePointer *ref_local;
  CapTableBuilder *capTable_local;
  SegmentBuilder *segment_local;
  
  bVar1 = SegmentBuilder::isWritable(segment);
  if (bVar1) {
    KVar2 = WirePointer::kind(ref);
    if (KVar2 < FAR) {
      pwVar6 = WirePointer::target(ref);
      zeroObject(segment,capTable,ref,pwVar6);
    }
    else if (KVar2 == FAR) {
      pBVar4 = SegmentBuilder::getArena(segment);
      id = DirectWireValue<kj::Id<unsigned_int,_capnp::_::Segment>_>::get
                     ((DirectWireValue<kj::Id<unsigned_int,_capnp::_::Segment>_> *)
                      &(ref->field_1).structRef);
      pSVar5 = BuilderArena::getSegment(pBVar4,(SegmentId)id.value);
      bVar1 = SegmentBuilder::isWritable(pSVar5);
      if (bVar1) {
        this = (WirePointer *)WirePointer::farTarget(ref,pSVar5);
        bVar1 = WirePointer::isDoubleFar(ref);
        if (bVar1) {
          pBVar4 = SegmentBuilder::getArena(pSVar5);
          f.exception._4_4_ =
               DirectWireValue<kj::Id<unsigned_int,_capnp::_::Segment>_>::get
                         ((DirectWireValue<kj::Id<unsigned_int,_capnp::_::Segment>_> *)
                          &(this->field_1).structRef);
          pSVar5 = BuilderArena::getSegment(pBVar4,(SegmentId)f.exception._4_4_);
          bVar1 = SegmentBuilder::isWritable(pSVar5);
          if (bVar1) {
            pwVar6 = WirePointer::farTarget(this,pSVar5);
            zeroObject(pSVar5,capTable,this + 1,pwVar6);
          }
          zeroMemory(this,2);
        }
        else {
          zeroObject(pSVar5,capTable,this);
          zeroMemory(this);
        }
      }
    }
    else if (KVar2 == OTHER) {
      bVar1 = WirePointer::isCapability(ref);
      if (bVar1) {
        uVar3 = DirectWireValue<unsigned_int>::get
                          ((DirectWireValue<unsigned_int> *)&(ref->field_1).structRef);
        (*(capTable->super_CapTableReader)._vptr_CapTableReader[2])(capTable,(ulong)uVar3);
      }
      else {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[22]>
                  (&local_40,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x286,FAILED,(char *)0x0,"\"Unknown pointer type.\"",
                   (char (*) [22])"Unknown pointer type.");
        kj::_::Debug::Fault::~Fault(&local_40);
      }
    }
  }
  return;
}

Assistant:

static void zeroObject(SegmentBuilder* segment, CapTableBuilder* capTable, WirePointer* ref) {
    // Zero out the pointed-to object.  Use when the pointer is about to be overwritten making the
    // target object no longer reachable.

    // We shouldn't zero out external data linked into the message.
    if (!segment->isWritable()) return;

    switch (ref->kind()) {
      case WirePointer::STRUCT:
      case WirePointer::LIST:
        zeroObject(segment, capTable, ref, ref->target());
        break;
      case WirePointer::FAR: {
        segment = segment->getArena()->getSegment(ref->farRef.segmentId.get());
        if (segment->isWritable()) {  // Don't zero external data.
          WirePointer* pad = reinterpret_cast<WirePointer*>(ref->farTarget(segment));

          if (ref->isDoubleFar()) {
            segment = segment->getArena()->getSegment(pad->farRef.segmentId.get());
            if (segment->isWritable()) {
              zeroObject(segment, capTable, pad + 1, pad->farTarget(segment));
            }
            zeroMemory(pad, G(2) * POINTERS);
          } else {
            zeroObject(segment, capTable, pad);
            zeroMemory(pad);
          }
        }
        break;
      }
      case WirePointer::OTHER:
        if (ref->isCapability()) {
#if CAPNP_LITE
          KJ_FAIL_ASSERT("Capability encountered in builder in lite mode?") { break; }
#else  // CAPNP_LINE
          capTable->dropCap(ref->capRef.index.get());
#endif  // CAPNP_LITE, else
        } else {
          KJ_FAIL_REQUIRE("Unknown pointer type.") { break; }
        }
        break;
    }
  }